

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O1

bool __thiscall
ON_PhysicallyBasedMaterialUserData::Parameters::IsValid(Parameters *this,ON_TextLog *text_log)

{
  double dVar1;
  bool bVar2;
  byte bVar3;
  
  if ((this->subsurface != -1.23432101234321e+308) || (NAN(this->subsurface))) {
    bVar3 = 0;
    bVar2 = ON_4fColor::IsValid(&this->subsurface_scattering_color,(ON_TextLog *)0x0);
    if (bVar2) {
      dVar1 = this->subsurface_scattering_radius;
      bVar3 = 0;
      if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
         ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
        dVar1 = this->metallic;
        bVar3 = 0;
        if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
           ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
          dVar1 = this->specular;
          bVar3 = 0;
          if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
             ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
            dVar1 = this->specular_tint;
            bVar3 = 0;
            if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
               ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
              dVar1 = this->roughness;
              bVar3 = 0;
              if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                 ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                dVar1 = this->anisotropic;
                bVar3 = 0;
                if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                   ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                  dVar1 = this->anisotropic_rotation;
                  bVar3 = 0;
                  if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                     ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                    dVar1 = this->sheen;
                    bVar3 = 0;
                    if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                       ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                      dVar1 = this->sheen_tint;
                      bVar3 = 0;
                      if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                         ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                        dVar1 = this->clearcoat;
                        bVar3 = 0;
                        if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                           ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                          dVar1 = this->clearcoat_roughness;
                          bVar3 = 0;
                          if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                             ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                            dVar1 = this->opacity_IOR;
                            bVar3 = 0;
                            if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                               ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                              dVar1 = this->opacity;
                              bVar3 = 0;
                              if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                                 ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                                dVar1 = this->opacity_roughness;
                                bVar3 = 0;
                                if (((dVar1 != -1.23432101234321e+308) || (NAN(dVar1))) &&
                                   ((dVar1 != 1.23432101234321e+308 || (NAN(dVar1))))) {
                                  bVar3 = 0;
                                  bVar2 = ON_4fColor::IsValid(&this->emission,(ON_TextLog *)0x0);
                                  if (bVar2) {
                                    bVar3 = -(this->alpha != -1.23432101234321e+308) &
                                            -(this->alpha != 1.23432101234321e+308);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  else {
    bVar3 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

bool IsValid(class ON_TextLog* text_log = nullptr) const
    {
      //!base_color.IsValid() means that PBR is not supported.
      //if (!base_color.IsValid()) return false;
      if (ON_UNSET_VALUE == subsurface) return false;
      if (!subsurface_scattering_color.IsValid()) return false;
      if (ON_IS_UNSET_DOUBLE(subsurface_scattering_radius)) return false;
      if (ON_IS_UNSET_DOUBLE(metallic)) return false;
      if (ON_IS_UNSET_DOUBLE(specular)) return false;
      if (ON_IS_UNSET_DOUBLE(specular_tint)) return false;
      if (ON_IS_UNSET_DOUBLE(roughness)) return false;
      if (ON_IS_UNSET_DOUBLE(anisotropic)) return false;
      if (ON_IS_UNSET_DOUBLE(anisotropic_rotation)) return false;
      if (ON_IS_UNSET_DOUBLE(sheen)) return false;
      if (ON_IS_UNSET_DOUBLE(sheen_tint)) return false;
      if (ON_IS_UNSET_DOUBLE(clearcoat)) return false;
      if (ON_IS_UNSET_DOUBLE(clearcoat_roughness)) return false;
      if (ON_IS_UNSET_DOUBLE(opacity_IOR)) return false;
      if (ON_IS_UNSET_DOUBLE(opacity)) return false;
      if (ON_IS_UNSET_DOUBLE(opacity_roughness)) return false;
      if (!emission.IsValid()) return false;
      if (ON_IS_UNSET_DOUBLE(alpha)) return false;

      return true;
    }